

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall
TasGrid::GridFourier::evaluateHierarchicalFunctionsInternalGPU<double>
          (GridFourier *this,double *gpu_x,int num_x,GpuVector<double> *wreal,
          GpuVector<double> *wimag)

{
  AccelerationContext *pAVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
  *this_00;
  pointer pCVar5;
  pointer pCVar6;
  double *pdVar7;
  double *pdVar8;
  unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
  *ccache;
  size_t num_weights;
  GpuVector<double> *wimag_local;
  GpuVector<double> *wreal_local;
  int num_x_local;
  double *gpu_x_local;
  GridFourier *this_local;
  
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  sVar3 = (long)iVar2 * (long)num_x;
  sVar4 = GpuVector<double>::size(wreal);
  if (sVar4 != sVar3) {
    GpuVector<double>::resize(wreal,(this->super_BaseCanonicalGrid).acceleration,sVar3);
  }
  sVar4 = GpuVector<double>::size(wimag);
  if (sVar4 != sVar3) {
    GpuVector<double>::resize(wimag,(this->super_BaseCanonicalGrid).acceleration,sVar3);
  }
  loadGpuNodes<double>(this);
  this_00 = getGpuCache<double>(this);
  pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  pCVar5 = ::std::
           unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           ::operator->(this_00);
  pCVar6 = ::std::
           unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           ::operator->(this_00);
  pdVar7 = GpuVector<double>::data(wreal);
  pdVar8 = GpuVector<double>::data(wimag);
  TasGpu::devalfor<double>
            (pAVar1,iVar2,num_x,&this->max_levels,gpu_x,&pCVar5->num_nodes,&pCVar6->points,pdVar7,
             pdVar8);
  return;
}

Assistant:

void GridFourier::evaluateHierarchicalFunctionsInternalGPU(const T gpu_x[], int num_x, GpuVector<T> &wreal, GpuVector<T> &wimag) const{
    size_t num_weights = ((size_t) points.getNumIndexes()) * ((size_t) num_x);
    if (wreal.size() != num_weights) wreal.resize(acceleration, num_weights);
    if (wimag.size() != num_weights) wimag.resize(acceleration, num_weights);
    loadGpuNodes<T>();
    auto& ccache = getGpuCache<T>();
    TasGpu::devalfor(acceleration, num_dimensions, num_x, max_levels, gpu_x, ccache->num_nodes, ccache->points, wreal.data(), wimag.data());
}